

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O0

bool __thiscall RangeHint::reconcile(RangeHint *this,RangeHint *b)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  RangeHint *pRVar4;
  int4 iVar5;
  int4 iVar6;
  Datatype *local_48;
  uintb umod;
  Datatype *sub;
  intb mod;
  RangeHint *tmp;
  RangeHint *a;
  RangeHint *b_local;
  RangeHint *this_local;
  
  tmp = this;
  a = b;
  b_local = this;
  iVar5 = Datatype::getSize(this->type);
  iVar6 = Datatype::getSize(a->type);
  pRVar4 = a;
  if (iVar5 < iVar6) {
    mod = (intb)a;
    a = tmp;
    tmp = pRVar4;
  }
  lVar1 = a->sstart;
  lVar2 = tmp->sstart;
  iVar5 = Datatype::getSize(tmp->type);
  sub = (Datatype *)((lVar1 - lVar2) % (long)iVar5);
  if ((long)sub < 0) {
    iVar5 = Datatype::getSize(tmp->type);
    sub = (Datatype *)((long)&sub->_vptr_Datatype + (long)iVar5);
  }
  umod = (uintb)tmp->type;
  local_48 = sub;
  while( true ) {
    bVar3 = false;
    if (umod != 0) {
      iVar5 = Datatype::getSize((Datatype *)umod);
      iVar6 = Datatype::getSize(a->type);
      bVar3 = iVar6 < iVar5;
    }
    if (!bVar3) break;
    umod = (**(code **)(*(long *)umod + 0x20))(umod,local_48,&local_48);
  }
  if (umod == 0) {
    this_local._7_1_ = false;
  }
  else if (local_48 == (Datatype *)0x0) {
    iVar5 = Datatype::getSize((Datatype *)umod);
    iVar6 = Datatype::getSize(a->type);
    if (iVar5 < iVar6) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RangeHint::reconcile(const RangeHint *b) const

{
  const RangeHint *a = this;
  if (a->type->getSize() < b->type->getSize()) {
    const RangeHint *tmp = b;
    b = a;			// Make sure b is smallest
    a = tmp;
  }
  intb mod = (b->sstart - a->sstart) % a->type->getSize();
  if (mod < 0)
    mod += a->type->getSize();

  Datatype *sub = a->type;
  uintb umod = mod;
  while((sub!=(Datatype *)0)&&(sub->getSize() > b->type->getSize()))
    sub = sub->getSubType(umod,&umod);

  if (sub == (Datatype *)0) return false;
  if (umod != 0) return false;
  if (sub->getSize() < b->type->getSize()) return false;
  return true;
}